

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O3

void __thiscall
cmExtraCodeBlocksGenerator::CreateNewProjectFile
          (cmExtraCodeBlocksGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs,string *filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmGlobalGenerator *pcVar2;
  pointer pcVar3;
  cmGeneratorTarget *pcVar4;
  cmSourceFile *this_00;
  iterator __position;
  size_type __n;
  pointer pbVar5;
  bool bVar6;
  TargetType TVar7;
  int iVar8;
  char *pcVar9;
  char *pcVar10;
  long lVar11;
  cmSystemTools *this_01;
  _Base_ptr p_Var12;
  long *plVar13;
  ostream *poVar14;
  string *psVar15;
  pointer ppcVar16;
  vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>> *this_02;
  iterator iVar17;
  mapped_type *__x;
  mapped_type *this_03;
  _Rb_tree_node_base *p_Var18;
  size_type *psVar19;
  _Base_ptr p_Var20;
  _Alloc_hider _Var21;
  cmExtraCodeBlocksGenerator *pcVar22;
  pointer pbVar23;
  cmMakefile *pcVar24;
  undefined8 uVar25;
  pointer ppcVar26;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *pvVar27;
  all_files_map_t allFiles;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  string fastTarget;
  string compiler;
  string unitFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headerExts;
  string virtualFolders;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cFiles;
  string make;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srcExts;
  Tree tree;
  cmGeneratedFileStream fout;
  undefined1 local_458 [32];
  _Rb_tree_node_base *local_438;
  size_t local_430;
  string local_428;
  string local_408;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *local_3e8;
  cmExtraCodeBlocksGenerator *local_3e0;
  allocator local_3d1;
  cmMakefile *local_3d0;
  undefined1 local_3c8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> local_380;
  string local_368;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_348;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_328;
  long *local_310 [2];
  long local_300 [2];
  pointer local_2f0;
  cmMakefile *local_2e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e0;
  Tree local_2c8;
  undefined1 local_278 [584];
  
  pcVar24 = (*(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
              _M_impl.super__Vector_impl_data._M_start)->Makefile;
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_278,(filename->_M_dataplus)._M_p,false);
  if (((byte)(*(_func_int **)(local_278._0_8_ + -0x18))[(long)(local_278 + 0x20)] & 5) == 0) {
    local_2c8.path._M_dataplus._M_p = (pointer)&local_2c8.path.field_2;
    local_2c8.path._M_string_length = 0;
    local_2c8.path.field_2._M_local_buf[0] = '\0';
    local_2c8.folders.super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_2c8.folders.super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2c8.folders.super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2c8.files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2c8.files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2c8.files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar2 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
    p_Var12 = (pcVar2->ProjectMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_3e8 = lgs;
    local_3e0 = this;
    if ((_Rb_tree_header *)p_Var12 != &(pcVar2->ProjectMap)._M_t._M_impl.super__Rb_tree_header) {
      local_3d0 = pcVar24;
      do {
        pcVar24 = local_3d0;
        local_3a8._M_allocated_capacity = 0;
        local_3a8._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_398._M_allocated_capacity = 0;
        for (p_Var20 = *(_Base_ptr *)(p_Var12 + 2); p_Var20 != p_Var12[2]._M_parent;
            p_Var20 = (_Base_ptr)&p_Var20->_M_parent) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_3a8
                     ,local_3a8._8_8_,*(undefined8 *)(*(long *)(*(long *)p_Var20 + 0x28) + 0x128),
                     *(undefined8 *)(*(long *)(*(long *)p_Var20 + 0x28) + 0x130));
        }
        local_458._0_8_ = local_458 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"CMAKE_ROOT","");
        pcVar9 = cmMakefile::GetDefinition(pcVar24,(string *)local_458);
        uVar25 = local_3a8._M_allocated_capacity;
        if ((undefined1 *)local_458._0_8_ != local_458 + 0x10) {
          operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
          uVar25 = local_3a8._M_allocated_capacity;
        }
        for (; uVar25 != local_3a8._8_8_;
            uVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(uVar25 + 0x20)) {
          pcVar10 = (char *)strlen(pcVar9);
          lVar11 = std::__cxx11::string::find((char *)uVar25,(ulong)pcVar9,0);
          if (lVar11 != 0) {
            this_01 = (cmSystemTools *)
                      cmLocalGenerator::GetSourceDirectory
                                ((cmLocalGenerator *)**(undefined8 **)(p_Var12 + 2));
            cmSystemTools::RelativePath_abi_cxx11_
                      ((string *)local_458,this_01,*(char **)uVar25,pcVar10);
            local_3c8._0_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_3c8._8_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_3c8._16_8_ = (pointer)0x0;
            cmsys::SystemTools::SplitPath
                      ((string *)local_458,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_3c8,false);
            pcVar3 = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_3c8._8_8_ + -0x20))->_M_dataplus)._M_p;
            local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_368,pcVar3,
                       pcVar3 + ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(local_3c8._8_8_ + -0x20))->_M_string_length);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_3c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_3c8._8_8_ + -0x20),(iterator)local_3c8._8_8_);
            if ((local_3c8._8_8_ != local_3c8._0_8_) &&
               (lVar11 = std::__cxx11::string::find((char *)local_458,0x59947a,0), lVar11 == -1)) {
              Tree::InsertPath(&local_2c8,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_3c8,1,&local_368);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_368._M_dataplus._M_p != &local_368.field_2) {
              operator_delete(local_368._M_dataplus._M_p,
                              CONCAT71(local_368.field_2._M_allocated_capacity._1_7_,
                                       local_368.field_2._M_local_buf[0]) + 1);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_3c8);
            if ((undefined1 *)local_458._0_8_ != local_458 + 0x10) {
              operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
            }
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_3a8);
        p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
        pcVar24 = local_3d0;
      } while ((_Rb_tree_header *)p_Var12 !=
               &(((local_3e0->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->ProjectMap
                )._M_t._M_impl.super__Rb_tree_header);
    }
    local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
    local_368._M_string_length = 0;
    local_368.field_2._M_local_buf[0] = '\0';
    Tree::BuildVirtualFolder(&local_2c8,&local_368);
    local_3a8._M_allocated_capacity = (size_type)&local_398;
    local_3a8._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_398._M_allocated_capacity = local_398._M_allocated_capacity & 0xffffffffffffff00;
    pcVar9 = cmLocalGenerator::GetSourceDirectory
                       (*(local_3e8->
                         super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                         )._M_impl.super__Vector_impl_data._M_start);
    pcVar22 = local_3e0;
    std::__cxx11::string::string((string *)local_3c8,pcVar9,(allocator *)local_310);
    plVar13 = (long *)std::__cxx11::string::append(local_3c8);
    pcVar9 = local_458 + 0x10;
    psVar19 = (size_type *)(plVar13 + 2);
    if ((size_type *)*plVar13 == psVar19) {
      local_458._16_8_ = *psVar19;
      local_458._24_8_ = plVar13[3];
      local_458._0_8_ = pcVar9;
    }
    else {
      local_458._16_8_ = *psVar19;
      local_458._0_8_ = (size_type *)*plVar13;
    }
    local_458._8_8_ = plVar13[1];
    *plVar13 = (long)psVar19;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    Tree::BuildUnit(&local_2c8,(string *)&local_3a8,(string *)local_458);
    if ((char *)local_458._0_8_ != pcVar9) {
      operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_3c8 + 0x10)) {
      operator_delete((void *)local_3c8._0_8_,(ulong)(local_3c8._16_8_ + 1));
    }
    GetCBCompilerId_abi_cxx11_((string *)local_3c8,pcVar22,pcVar24);
    local_458._0_8_ = pcVar9;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"CMAKE_MAKE_PROGRAM","");
    pcVar10 = cmMakefile::GetRequiredDefinition(pcVar24,(string *)local_458);
    std::__cxx11::string::string((string *)local_310,pcVar10,(allocator *)&local_408);
    if ((char *)local_458._0_8_ != pcVar9) {
      operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,
               "<?xml version=\"1.0\" encoding=\"UTF-8\" standalone=\"yes\" ?>\n<CodeBlocks_project_file>\n   <FileVersion major=\"1\" minor=\"6\" />\n   <Project>\n      <Option title=\""
               ,0x9c);
    cmLocalGenerator::GetProjectName_abi_cxx11_
              ((string *)local_458,
               *(local_3e8->
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl
                .super__Vector_impl_data._M_start);
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_278,(char *)local_458._0_8_,local_458._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,"\" />\n      <Option makefile_is_custom=\"1\" />\n      <Option compiler=\""
               ,0x45);
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar14,(char *)local_3c8._0_8_,local_3c8._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\" />\n      ",0xb);
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar14,local_368._M_dataplus._M_p,local_368._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n      <Build>\n",0xf);
    if ((char *)local_458._0_8_ != pcVar9) {
      operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
    }
    local_458._0_8_ = pcVar9;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"all","");
    AppendTarget(pcVar22,(cmGeneratedFileStream *)local_278,(string *)local_458,
                 (cmGeneratorTarget *)0x0,(char *)local_310[0],
                 *(local_3e8->
                  super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                  _M_impl.super__Vector_impl_data._M_start,(char *)local_3c8._0_8_);
    if ((char *)local_458._0_8_ != pcVar9) {
      operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
    }
    ppcVar16 = (local_3e8->
               super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
               super__Vector_impl_data._M_start;
    if (ppcVar16 !=
        (local_3e8->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      do {
        std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
                  ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&local_428,
                   &(*ppcVar16)->GeneratorTargets);
        _Var21._M_p = local_428._M_dataplus._M_p;
        if (local_428._M_dataplus._M_p != (pointer)local_428._M_string_length) {
          do {
            psVar15 = cmGeneratorTarget::GetName_abi_cxx11_(*(cmGeneratorTarget **)_Var21._M_p);
            pcVar3 = (psVar15->_M_dataplus)._M_p;
            local_458._0_8_ = local_458 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_458,pcVar3,pcVar3 + psVar15->_M_string_length);
            TVar7 = cmGeneratorTarget::GetType(*(cmGeneratorTarget **)_Var21._M_p);
            if (TVar7 < UTILITY) {
              pcVar4 = *(cmGeneratorTarget **)_Var21._M_p;
              AppendTarget(local_3e0,(cmGeneratedFileStream *)local_278,(string *)local_458,pcVar4,
                           (char *)local_310[0],*ppcVar16,(char *)local_3c8._0_8_);
              local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_408,local_458._0_8_,
                         (char *)(local_458._0_8_ + local_458._8_8_));
              std::__cxx11::string::append((char *)&local_408);
              AppendTarget(local_3e0,(cmGeneratedFileStream *)local_278,&local_408,pcVar4,
                           (char *)local_310[0],*ppcVar16,(char *)local_3c8._0_8_);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_408._M_dataplus._M_p != &local_408.field_2) {
                operator_delete(local_408._M_dataplus._M_p,
                                local_408.field_2._M_allocated_capacity + 1);
              }
            }
            else if (TVar7 == UTILITY) {
              lVar11 = std::__cxx11::string::find((char *)local_458,0x595f6d,0);
              if (((lVar11 != 0) ||
                  (iVar8 = std::__cxx11::string::compare((char *)local_458), iVar8 == 0)) &&
                 ((lVar11 = std::__cxx11::string::find((char *)local_458,0x595e69,0), lVar11 != 0 ||
                  (iVar8 = std::__cxx11::string::compare((char *)local_458), iVar8 == 0)))) {
                lVar11 = std::__cxx11::string::find((char *)local_458,0x595ee8,0);
                if (lVar11 == 0) {
                  iVar8 = std::__cxx11::string::compare((char *)local_458);
                  goto LAB_004278c2;
                }
LAB_00427921:
                AppendTarget(local_3e0,(cmGeneratedFileStream *)local_278,(string *)local_458,
                             (cmGeneratorTarget *)0x0,(char *)local_310[0],*ppcVar16,
                             (char *)local_3c8._0_8_);
              }
            }
            else if (TVar7 == GLOBAL_TARGET) {
              pcVar9 = cmLocalGenerator::GetCurrentBinaryDirectory(*ppcVar16);
              pcVar10 = cmLocalGenerator::GetBinaryDirectory(*ppcVar16);
              iVar8 = strcmp(pcVar9,pcVar10);
LAB_004278c2:
              if (iVar8 == 0) goto LAB_00427921;
            }
            if ((undefined1 *)local_458._0_8_ != local_458 + 0x10) {
              operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
            }
            _Var21._M_p = _Var21._M_p + 8;
          } while (_Var21._M_p != (pointer)local_428._M_string_length);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_428._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_428._M_dataplus._M_p,
                          local_428.field_2._M_allocated_capacity - (long)local_428._M_dataplus._M_p
                         );
        }
        ppcVar16 = ppcVar16 + 1;
      } while (ppcVar16 !=
               (local_3e8->
               super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"      </Build>\n",0xf);
    pcVar22 = local_3e0;
    local_458._24_8_ = local_458 + 8;
    local_458._8_8_ = local_458._8_8_ & 0xffffffff00000000;
    local_458._16_8_ = 0;
    local_430 = 0;
    local_328.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_328.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_328.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    local_438 = (_Rb_tree_node_base *)local_458._24_8_;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_2e0,
             &((local_3e0->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->CMakeInstance
              ->SourceFileExtensions);
    ppcVar16 = (local_3e8->
               super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
               super__Vector_impl_data._M_start;
    pvVar27 = local_3e8;
    if (ppcVar16 !=
        (local_3e8->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      do {
        local_2e8 = (*ppcVar16)->Makefile;
        local_2f0 = ppcVar16;
        std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
                  (&local_380,&(*ppcVar16)->GeneratorTargets);
        pcVar24 = (cmMakefile *)
                  local_380.
                  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (local_380.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            local_380.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          do {
            local_3d0 = pcVar24;
            TVar7 = cmGeneratorTarget::GetType
                              (*(cmGeneratorTarget **)&(pcVar24->CMP0054ReportedIds)._M_t._M_impl);
            if (TVar7 < GLOBAL_TARGET) {
              local_348.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_348.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_348.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              pcVar4 = *(cmGeneratorTarget **)&(local_3d0->CMP0054ReportedIds)._M_t._M_impl;
              local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_428,"CMAKE_BUILD_TYPE","");
              pcVar9 = cmMakefile::GetSafeDefinition(local_2e8,&local_428);
              std::__cxx11::string::string((string *)&local_408,pcVar9,&local_3d1);
              cmGeneratorTarget::GetSourceFiles(pcVar4,&local_348,&local_408);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_408._M_dataplus._M_p != &local_408.field_2) {
                operator_delete(local_408._M_dataplus._M_p,
                                local_408.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_428._M_dataplus._M_p != &local_428.field_2) {
                operator_delete(local_428._M_dataplus._M_p,
                                local_428.field_2._M_allocated_capacity + 1);
              }
              ppcVar26 = local_348.
                         super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
                         .super__Vector_impl_data._M_start;
              if (local_348.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_start !=
                  local_348.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
                do {
                  this_00 = *ppcVar26;
                  local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_408,"GENERATED","");
                  bVar6 = cmSourceFile::GetPropertyAsBool(this_00,&local_408);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_408._M_dataplus._M_p != &local_408.field_2) {
                    operator_delete(local_408._M_dataplus._M_p,
                                    local_408.field_2._M_allocated_capacity + 1);
                  }
                  if (!bVar6) {
                    cmSourceFile::GetLanguage_abi_cxx11_(&local_408,*ppcVar26);
                    iVar8 = std::__cxx11::string::compare((char *)&local_408);
                    if ((iVar8 == 0) ||
                       (iVar8 = std::__cxx11::string::compare((char *)&local_408), iVar8 == 0)) {
                      psVar15 = cmSourceFile::GetExtension_abi_cxx11_(*ppcVar26);
                      pcVar3 = (psVar15->_M_dataplus)._M_p;
                      local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_428,pcVar3,pcVar3 + psVar15->_M_string_length);
                      pbVar5 = local_2e0.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                      __n = local_428._M_string_length;
                      _Var21._M_p = local_428._M_dataplus._M_p;
                      for (pbVar23 = local_2e0.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start; pbVar23 != pbVar5;
                          pbVar23 = pbVar23 + 1) {
                        if (((size_type *)__n == (size_type *)pbVar23->_M_string_length) &&
                           ((bVar6 = true, (size_type *)__n == (size_type *)0x0 ||
                            (iVar8 = bcmp(_Var21._M_p,(pbVar23->_M_dataplus)._M_p,__n), iVar8 == 0))
                           )) goto LAB_00427c7f;
                      }
                      bVar6 = false;
LAB_00427c7f:
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)_Var21._M_p != &local_428.field_2) {
                        operator_delete(_Var21._M_p,local_428.field_2._M_allocated_capacity + 1);
                      }
                    }
                    else {
                      bVar6 = false;
                    }
                    psVar15 = cmSourceFile::GetFullPath(*ppcVar26,(string *)0x0);
                    pcVar3 = (psVar15->_M_dataplus)._M_p;
                    local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_428,pcVar3,pcVar3 + psVar15->_M_string_length);
                    if (bVar6) {
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::push_back(&local_328,&local_428);
                    }
                    this_02 = (vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>
                               *)std::
                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                                               *)local_458,&local_428);
                    __position._M_current = *(cmGeneratorTarget ***)(this_02 + 8);
                    if (__position._M_current == *(cmGeneratorTarget ***)(this_02 + 0x10)) {
                      std::vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>
                      ::_M_realloc_insert<cmGeneratorTarget_const*const&>
                                (this_02,__position,(cmGeneratorTarget **)local_3d0);
                    }
                    else {
                      *__position._M_current =
                           *(cmGeneratorTarget **)&(local_3d0->CMP0054ReportedIds)._M_t._M_impl;
                      *(long *)(this_02 + 8) = *(long *)(this_02 + 8) + 8;
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_428._M_dataplus._M_p != &local_428.field_2) {
                      operator_delete(local_428._M_dataplus._M_p,
                                      local_428.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_408._M_dataplus._M_p != &local_408.field_2) {
                      operator_delete(local_408._M_dataplus._M_p,
                                      local_408.field_2._M_allocated_capacity + 1);
                    }
                  }
                  ppcVar26 = ppcVar26 + 1;
                } while (ppcVar26 !=
                         local_348.
                         super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
                         .super__Vector_impl_data._M_finish);
              }
              pcVar22 = local_3e0;
              pvVar27 = local_3e8;
              if (local_348.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_348.
                                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_348.
                                      super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_348.
                                      super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
                pcVar22 = local_3e0;
                pvVar27 = local_3e8;
              }
            }
            pcVar24 = (cmMakefile *)
                      &(local_3d0->CMP0054ReportedIds)._M_t._M_impl.super__Rb_tree_header;
          } while (pcVar24 !=
                   (cmMakefile *)
                   local_380.
                   super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
        }
        if ((cmMakefile *)
            local_380.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
            _M_impl.super__Vector_impl_data._M_start != (cmMakefile *)0x0) {
          operator_delete(local_380.
                          super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_380.
                                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_380.
                                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        ppcVar16 = local_2f0 + 1;
      } while (ppcVar16 !=
               (pvVar27->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
               )._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_380,
             &((pcVar22->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->CMakeInstance->
              HeaderFileExtensions);
    if (local_328.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_328.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      paVar1 = &local_428.field_2;
      pbVar23 = local_328.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        cmsys::SystemTools::GetFilenamePath(&local_408,pbVar23);
        std::__cxx11::string::append((char *)&local_408);
        cmsys::SystemTools::GetFilenameWithoutExtension(&local_428,pbVar23);
        std::__cxx11::string::_M_append((char *)&local_408,(ulong)local_428._M_dataplus._M_p);
        pcVar24 = (cmMakefile *)
                  local_380.
                  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_428._M_dataplus._M_p != paVar1) {
          operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
          pcVar24 = (cmMakefile *)
                    local_380.
                    super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        }
        for (; pcVar24 !=
               (cmMakefile *)
               local_380.
               super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl
               .super__Vector_impl_data._M_finish;
            pcVar24 = (cmMakefile *)
                      &(pcVar24->CMP0054ReportedIds)._M_t._M_impl.super__Rb_tree_header._M_header.
                       _M_right) {
          local_428._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_428,local_408._M_dataplus._M_p,
                     local_408._M_dataplus._M_p + local_408._M_string_length);
          std::__cxx11::string::append((char *)&local_428);
          std::__cxx11::string::_M_append
                    ((char *)&local_428,*(ulong *)&(pcVar24->CMP0054ReportedIds)._M_t._M_impl);
          iVar17 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                           *)local_458,&local_428);
          if (iVar17._M_node != (_Base_ptr)(local_458 + 8)) {
LAB_00427f22:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_428._M_dataplus._M_p != paVar1) {
              operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1
                             );
            }
            break;
          }
          bVar6 = cmsys::SystemTools::FileExists(local_428._M_dataplus._M_p);
          if (bVar6) {
            __x = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                                *)local_458,pbVar23);
            this_03 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                                    *)local_458,&local_428);
            std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
            operator=(&this_03->Targets,&__x->Targets);
            goto LAB_00427f22;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_428._M_dataplus._M_p != paVar1) {
            operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408._M_dataplus._M_p != &local_408.field_2) {
          operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
        }
        pbVar23 = pbVar23 + 1;
      } while (pbVar23 !=
               local_328.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    if ((_Rb_tree_node_base *)local_458._24_8_ != (_Rb_tree_node_base *)(local_458 + 8)) {
      p_Var18 = (_Rb_tree_node_base *)local_458._24_8_;
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_278,"      <Unit filename=\"",0x16);
        cmXMLSafe::cmXMLSafe((cmXMLSafe *)&local_408,(string *)(p_Var18 + 1));
        poVar14 = operator<<((ostream *)local_278,(cmXMLSafe *)&local_408);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\">\n",3);
        for (p_Var12 = *(_Base_ptr *)(p_Var18 + 2); p_Var12 != p_Var18[2]._M_parent;
            p_Var12 = (_Base_ptr)&p_Var12->_M_parent) {
          psVar15 = cmGeneratorTarget::GetName_abi_cxx11_(*(cmGeneratorTarget **)p_Var12);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_278,"         <Option target=\"",0x19);
          cmXMLSafe::cmXMLSafe((cmXMLSafe *)&local_408,psVar15);
          poVar14 = operator<<((ostream *)local_278,(cmXMLSafe *)&local_408);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\"/>\n",4);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_278,"      </Unit>\n",0xe);
        p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18);
      } while (p_Var18 != (_Rb_tree_node_base *)(local_458 + 8));
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,(char *)local_3a8._M_allocated_capacity,local_3a8._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"   </Project>\n</CodeBlocks_project_file>\n",0x29);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_380);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2e0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_328);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                 *)local_458);
    if (local_310[0] != local_300) {
      operator_delete(local_310[0],local_300[0] + 1);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_3c8 + 0x10)) {
      operator_delete((void *)local_3c8._0_8_,(ulong)(local_3c8._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_allocated_capacity != &local_398) {
      operator_delete((void *)local_3a8._M_allocated_capacity,local_398._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != &local_368.field_2) {
      operator_delete(local_368._M_dataplus._M_p,
                      CONCAT71(local_368.field_2._M_allocated_capacity._1_7_,
                               local_368.field_2._M_local_buf[0]) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2c8.files);
    std::vector<Tree,_std::allocator<Tree>_>::~vector(&local_2c8.folders);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8.path._M_dataplus._M_p != &local_2c8.path.field_2) {
      operator_delete(local_2c8.path._M_dataplus._M_p,
                      CONCAT71(local_2c8.path.field_2._M_allocated_capacity._1_7_,
                               local_2c8.path.field_2._M_local_buf[0]) + 1);
    }
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
  return;
}

Assistant:

void cmExtraCodeBlocksGenerator
  ::CreateNewProjectFile(const std::vector<cmLocalGenerator*>& lgs,
                         const std::string& filename)
{
  const cmMakefile* mf=lgs[0]->GetMakefile();
  cmGeneratedFileStream fout(filename.c_str());
  if(!fout)
    {
    return;
    }

  Tree tree;

  // build tree of virtual folders
  for (std::map<std::string, std::vector<cmLocalGenerator*> >::const_iterator
          it = this->GlobalGenerator->GetProjectMap().begin();
         it != this->GlobalGenerator->GetProjectMap().end();
         ++it)
    {
    // Collect all files
    std::vector<std::string> listFiles;
    for (std::vector<cmLocalGenerator *>::const_iterator
         jt = it->second.begin();
         jt != it->second.end();
         ++jt)
      {
      const std::vector<std::string> & files =
                                          (*jt)->GetMakefile()->GetListFiles();
      listFiles.insert(listFiles.end(), files.begin(), files.end());
      }

    // Convert
    const char* cmakeRoot = mf->GetDefinition("CMAKE_ROOT");
    for (std::vector<std::string>::const_iterator jt = listFiles.begin();
         jt != listFiles.end();
         ++jt)
      {
      // don't put cmake's own files into the project (#12110):
      if (jt->find(cmakeRoot) == 0)
        {
        continue;
        }

      const std::string &relative = cmSystemTools::RelativePath(
                         it->second[0]->GetSourceDirectory(),
                         jt->c_str());
      std::vector<std::string> splitted;
      cmSystemTools::SplitPath(relative, splitted, false);
      // Split filename from path
      std::string fileName = *(splitted.end()-1);
      splitted.erase(splitted.end() - 1, splitted.end());

      // We don't want paths with CMakeFiles in them
      // or do we?
      // In speedcrunch those where purely internal
      if (splitted.size() >= 1
          && relative.find("CMakeFiles") == std::string::npos)
        {
        tree.InsertPath(splitted, 1, fileName);
        }
      }
    }

  // Now build a virtual tree string
  std::string virtualFolders;
  tree.BuildVirtualFolder(virtualFolders);
  // And one for <Unit>
  std::string unitFiles;
  tree.BuildUnit(unitFiles, std::string(lgs[0]->GetSourceDirectory()) + "/");

  // figure out the compiler
  std::string compiler = this->GetCBCompilerId(mf);
  std::string make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");

  fout<<"<?xml version=\"1.0\" encoding=\"UTF-8\" standalone=\"yes\" ?>\n"
        "<CodeBlocks_project_file>\n"
        "   <FileVersion major=\"1\" minor=\"6\" />\n"
        "   <Project>\n"
        "      <Option title=\"" << lgs[0]->GetProjectName()<<"\" />\n"
        "      <Option makefile_is_custom=\"1\" />\n"
        "      <Option compiler=\"" << compiler << "\" />\n"
        "      "<<virtualFolders<<"\n"
        "      <Build>\n";

  this->AppendTarget(fout, "all", 0, make.c_str(), lgs[0], compiler.c_str());

  // add all executable and library targets and some of the GLOBAL
  // and UTILITY targets
  for (std::vector<cmLocalGenerator*>::const_iterator lg=lgs.begin();
       lg!=lgs.end(); lg++)
    {
    std::vector<cmGeneratorTarget*> targets=(*lg)->GetGeneratorTargets();
    for (std::vector<cmGeneratorTarget*>::iterator ti = targets.begin();
         ti != targets.end(); ti++)
      {
      std::string targetName = (*ti)->GetName();
      switch((*ti)->GetType())
        {
        case cmState::GLOBAL_TARGET:
          {
          // Only add the global targets from CMAKE_BINARY_DIR,
          // not from the subdirs
          if (strcmp((*lg)->GetCurrentBinaryDirectory(),
                     (*lg)->GetBinaryDirectory())==0)
            {
            this->AppendTarget(fout, targetName, 0,
                               make.c_str(), *lg, compiler.c_str());
            }
          }
          break;
        case cmState::UTILITY:
          // Add all utility targets, except the Nightly/Continuous/
          // Experimental-"sub"targets as e.g. NightlyStart
          if (((targetName.find("Nightly")==0)   &&(targetName!="Nightly"))
             || ((targetName.find("Continuous")==0)
                 &&(targetName!="Continuous"))
             || ((targetName.find("Experimental")==0)
                                             && (targetName!="Experimental")))
            {
            break;
            }

          this->AppendTarget(fout, targetName, 0,
                                 make.c_str(), *lg, compiler.c_str());
          break;
        case cmState::EXECUTABLE:
        case cmState::STATIC_LIBRARY:
        case cmState::SHARED_LIBRARY:
        case cmState::MODULE_LIBRARY:
        case cmState::OBJECT_LIBRARY:
          {
          cmGeneratorTarget* gt = *ti;
          this->AppendTarget(fout, targetName, gt,
                             make.c_str(), *lg, compiler.c_str());
          std::string fastTarget = targetName;
          fastTarget += "/fast";
          this->AppendTarget(fout, fastTarget, gt,
                             make.c_str(), *lg, compiler.c_str());
          }
          break;
        default:
          break;
        }
      }
    }

  fout<<"      </Build>\n";


  // Collect all used source files in the project.
  // Keep a list of C/C++ source files which might have an acompanying header
  // that should be looked for.
  typedef std::map<std::string, CbpUnit> all_files_map_t;
  all_files_map_t allFiles;
  std::vector<std::string> cFiles;

  std::vector<std::string> srcExts =
      this->GlobalGenerator->GetCMakeInstance()->GetSourceExtensions();

  for (std::vector<cmLocalGenerator*>::const_iterator lg=lgs.begin();
       lg!=lgs.end(); lg++)
    {
    cmMakefile* makefile=(*lg)->GetMakefile();
    std::vector<cmGeneratorTarget*> targets=(*lg)->GetGeneratorTargets();
    for (std::vector<cmGeneratorTarget*>::iterator ti = targets.begin();
         ti != targets.end(); ti++)
      {
      switch((*ti)->GetType())
        {
        case cmState::EXECUTABLE:
        case cmState::STATIC_LIBRARY:
        case cmState::SHARED_LIBRARY:
        case cmState::MODULE_LIBRARY:
        case cmState::OBJECT_LIBRARY:
        case cmState::UTILITY: // can have sources since 2.6.3
          {
          std::vector<cmSourceFile*> sources;
          cmGeneratorTarget* gt = *ti;
          gt->GetSourceFiles(sources,
                            makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
          for (std::vector<cmSourceFile*>::const_iterator si=sources.begin();
               si!=sources.end(); si++)
            {
            // don't add source files which have the GENERATED property set:
            if ((*si)->GetPropertyAsBool("GENERATED"))
              {
              continue;
              }

            // check whether it is a C/C++ implementation file
            bool isCFile = false;
            std::string lang = (*si)->GetLanguage();
            if (lang == "C" || lang == "CXX")
              {
              std::string srcext = (*si)->GetExtension();
              for(std::vector<std::string>::const_iterator
                  ext = srcExts.begin(); ext != srcExts.end(); ++ext)
                {
                if (srcext == *ext)
                  {
                  isCFile = true;
                  break;
                  }
                }
              }

            std::string fullPath = (*si)->GetFullPath();

            if(isCFile)
              {
              cFiles.push_back(fullPath);
              }

            CbpUnit &cbpUnit = allFiles[fullPath];
            cbpUnit.Targets.push_back(*ti);
            }
          }
        default:  // intended fallthrough
          break;
        }
      }
    }

  std::vector<std::string> headerExts =
      this->GlobalGenerator->GetCMakeInstance()->GetHeaderExtensions();

  // The following loop tries to add header files matching to implementation
  // files to the project. It does that by iterating over all
  // C/C++ source files,
  // replacing the file name extension with ".h" and checks whether such a
  // file exists. If it does, it is inserted into the map of files.
  // A very similar version of that code exists also in the kdevelop
  // project generator.
  for (std::vector<std::string>::const_iterator
       sit=cFiles.begin();
       sit!=cFiles.end();
       ++sit)
    {
    std::string const& fileName = *sit;
    std::string headerBasename=cmSystemTools::GetFilenamePath(fileName);
    headerBasename+="/";
    headerBasename+=cmSystemTools::GetFilenameWithoutExtension(fileName);

    // check if there's a matching header around
    for(std::vector<std::string>::const_iterator
        ext = headerExts.begin();
        ext != headerExts.end();
        ++ext)
      {
      std::string hname=headerBasename;
      hname += ".";
      hname += *ext;
      // if it's already in the set, don't check if it exists on disk
      if (allFiles.find(hname) != allFiles.end())
        {
        break;
        }

      if(cmSystemTools::FileExists(hname.c_str()))
        {
        allFiles[hname].Targets = allFiles[fileName].Targets;
        break;
        }
      }
    }

  // insert all source files in the CodeBlocks project
  for (all_files_map_t::const_iterator
       sit=allFiles.begin();
       sit!=allFiles.end();
       ++sit)
    {
    std::string const& unitFilename = sit->first;
    CbpUnit const& unit = sit->second;

    fout<<"      <Unit filename=\""<< cmXMLSafe(unitFilename) <<"\">\n";

    for(std::vector<const cmGeneratorTarget*>::const_iterator ti =
        unit.Targets.begin();
        ti != unit.Targets.end(); ++ti)
      {
      std::string const& targetName = (*ti)->GetName();
      fout<<"         <Option target=\""<< cmXMLSafe(targetName) <<"\"/>\n";
      }

    fout<<"      </Unit>\n";
    }

  // Add CMakeLists.txt
  fout<<unitFiles;

  fout<<"   </Project>\n"
        "</CodeBlocks_project_file>\n";
}